

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  ulong uVar1;
  ulong uVar2;
  REF_DBL *pRVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  pRVar3 = xyz;
  for (; uVar1 != 3; uVar1 = uVar1 + 1) {
    center[uVar1] = 0.0;
    dVar5 = 0.0;
    for (lVar4 = 0; uVar2 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      dVar5 = dVar5 + *(double *)((long)pRVar3 + lVar4);
      center[uVar1] = dVar5;
    }
    center[uVar1] = dVar5 / (double)n;
    pRVar3 = pRVar3 + 1;
  }
  *radius = 0.0;
  dVar5 = 0.0;
  for (lVar4 = 0; uVar2 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
    dVar6 = *(double *)((long)xyz + lVar4 + 8) - center[1];
    dVar7 = *(double *)((long)xyz + lVar4) - *center;
    dVar8 = *(double *)((long)xyz + lVar4 + 0x10) - center[2];
    dVar6 = SQRT(dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7);
    if (dVar5 <= dVar6) {
      dVar5 = dVar6;
    }
    *radius = dVar5;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz, REF_INT n,
                                                REF_DBL *center,
                                                REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += xyz[i + 3 * j];
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(*radius, sqrt(pow(xyz[0 + 3 * i] - center[0], 2) +
                                pow(xyz[1 + 3 * i] - center[1], 2) +
                                pow(xyz[2 + 3 * i] - center[2], 2)));
  return REF_SUCCESS;
}